

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O0

void __thiscall foxxll::stats::stats(stats *this)

{
  double dVar1;
  stats *this_local;
  
  dVar1 = timestamp();
  this->creation_time_ = dVar1;
  std::__cxx11::list<foxxll::file_stats,_std::allocator<foxxll::file_stats>_>::list
            (&this->file_stats_list_);
  std::mutex::mutex(&this->list_mutex_);
  this->p_reads_ = 0.0;
  this->p_writes_ = 0.0;
  this->p_begin_read_ = 0.0;
  this->p_begin_write_ = 0.0;
  this->p_ios_ = 0.0;
  this->p_begin_io_ = 0.0;
  this->acc_reads_ = 0;
  this->acc_writes_ = 0;
  this->acc_ios_ = 0;
  this->t_waits_ = 0.0;
  this->p_waits_ = 0.0;
  this->p_begin_wait_ = 0.0;
  this->t_wait_read_ = 0.0;
  this->p_wait_read_ = 0.0;
  this->p_begin_wait_read_ = 0.0;
  this->t_wait_write_ = 0.0;
  this->p_wait_write_ = 0.0;
  this->p_begin_wait_write_ = 0.0;
  this->acc_waits_ = 0;
  this->acc_wait_read_ = 0;
  this->acc_wait_write_ = 0;
  std::mutex::mutex(&this->wait_mutex_);
  std::mutex::mutex(&this->read_mutex_);
  std::mutex::mutex(&this->write_mutex_);
  std::mutex::mutex(&this->io_mutex_);
  return;
}

Assistant:

stats::stats()
    : creation_time_(timestamp()),
      p_reads_(0.0), p_writes_(0.0),
      p_begin_read_(0.0), p_begin_write_(0.0),
      p_ios_(0.0),
      p_begin_io_(0.0),

      acc_reads_(0.0), acc_writes_(0.0),
      acc_ios_(0.0),

      t_waits_(0.0), p_waits_(0.0),
      p_begin_wait_(0.0),
      t_wait_read_(0.0), p_wait_read_(0.0),
      p_begin_wait_read_(0.0),
      t_wait_write_(0.0), p_wait_write_(0.0),
      p_begin_wait_write_(0.0),
      acc_waits_(0.0),
      acc_wait_read_(0.0), acc_wait_write_(0.0)
{ }